

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_RCX;
  void **in_RDX;
  Option *in_RSI;
  Mat *in_RDI;
  bool bVar7;
  Option *in_stack_00000038;
  int in_stack_00000044;
  Mat *in_stack_00000048;
  Mat *in_stack_00000050;
  Mat *in_stack_00000058;
  Mat *in_stack_00000060;
  int ret_2;
  int _nT_1;
  bool prefer_sgemm;
  int l2_cache_size;
  int ret_1;
  int _nT;
  bool prefer_winograd43;
  bool prefer_winograd23;
  bool prefer_winograd63;
  bool prefer_winograd;
  int num_input;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int ret;
  Mat top_blob_3d;
  Mat bottom_blob_3d;
  int in_stack_00000470;
  int in_stack_00000478;
  int in_stack_00000480;
  int in_stack_00000488;
  int in_stack_00000490;
  Option *in_stack_00000498;
  int in_stack_000007a8;
  int in_stack_000007ac;
  Mat *in_stack_000007b0;
  Mat *in_stack_000007b8;
  Mat *in_stack_000007c0;
  Mat *in_stack_000007c8;
  Option *in_stack_000011b0;
  Mat *in_stack_000011b8;
  Mat *in_stack_000011c0;
  Mat *in_stack_000011c8;
  Mat *in_stack_000011d0;
  Option *in_stack_00001b60;
  Mat *in_stack_00001b68;
  Mat *in_stack_00001b70;
  Mat *in_stack_00001b78;
  Mat *in_stack_00001b80;
  int in_stack_00003e30;
  int in_stack_00003e38;
  int in_stack_00003e40;
  int in_stack_00003e48;
  int in_stack_00003e50;
  Mat *in_stack_00003e58;
  Option *in_stack_00003e60;
  Option *in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  int in_stack_fffffffffffff964;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  int in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  undefined8 in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  int in_stack_fffffffffffff994;
  undefined8 in_stack_fffffffffffff998;
  void **ppvVar8;
  int in_stack_fffffffffffff9a0;
  undefined6 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f6;
  undefined1 in_stack_fffffffffffff9f7;
  Allocator *in_stack_fffffffffffff9f8;
  byte local_5fd;
  int in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  bool local_5c1;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  undefined8 in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  Mat *in_stack_fffffffffffffa88;
  int local_4d8;
  byte local_4d0;
  bool local_4cf;
  bool local_4ce;
  int local_4bc;
  void *local_4b0;
  int *local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  long *local_490;
  undefined4 local_488;
  int local_484;
  int local_480;
  undefined4 local_47c;
  int local_478;
  long local_470;
  int local_464;
  int local_460;
  int local_45c;
  Allocator *local_458;
  int local_44c;
  int local_448;
  int local_444;
  void *local_440;
  int *local_438;
  void *local_430;
  undefined4 local_428;
  long *local_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  void *local_400;
  int local_3f4;
  void *local_3f0;
  int *local_3e8;
  void *local_3e0;
  undefined4 local_3d8;
  long *local_3d0;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  void *local_3b0;
  undefined4 local_3a4;
  void *local_3a0;
  Allocator *local_398;
  undefined8 local_390;
  undefined4 local_388;
  long *local_380;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 local_36c;
  int local_368;
  long local_360;
  void *local_348;
  Option *in_stack_fffffffffffffcc0;
  Allocator *pAVar9;
  Mat *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  Convolution_x86 *in_stack_fffffffffffffcd8;
  long *plVar10;
  int local_310;
  long local_308;
  Mat *top_blob_00;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  Convolution_x86 *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff980 >> 0x20);
  if (((*(byte *)(in_RCX + 0x1e) & 1) != 0) && (in_RDI[3].h != 0)) {
    iVar3 = forward_int8_x86(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    return iVar3;
  }
  if (((in_RSI->vulkan_device_index != 1) || (*(int *)((long)&in_RDI[2].cstep + 4) != 1)) ||
     (*(int *)&in_RDI[3].data != 1)) {
    local_444._0_1_ = in_RSI->use_reserved_1;
    local_444._1_1_ = in_RSI->use_image_storage;
    local_444._2_1_ = in_RSI->use_tensor_storage;
    local_444._3_1_ = in_RSI->use_reserved_2;
    local_448 = in_RSI->flush_denormals;
    local_44c._0_1_ = in_RSI->use_winograd43_convolution;
    local_44c._1_1_ = in_RSI->use_winograd63_convolution;
    local_44c._2_1_ = in_RSI->use_a53_a55_optimized_kernel;
    local_44c._3_1_ = in_RSI->use_fp16_uniform;
    local_458 = in_RSI->workspace_allocator;
    local_45c = in_RSI->openmp_blocktime;
    local_460 = *(int *)((long)&in_RDI[3].data + 4) * (*(int *)((long)&in_RDI[2].cstep + 4) + -1) +
                1;
    local_464 = *(int *)&in_RDI[3].refcount * (*(int *)&in_RDI[3].data + -1) + 1;
    local_4b0 = (void *)0x0;
    local_4a8 = (int *)0x0;
    local_4a0 = 0;
    local_498 = 0;
    local_490 = (long *)0x0;
    local_488 = 0;
    local_484 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_470 = 0;
    top_blob_00 = in_RDI;
    Convolution::make_padding
              ((Convolution *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
               (Mat *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (Mat *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff958);
    local_5c1 = local_4b0 == (void *)0x0 || local_470 * local_478 == 0;
    if (local_5c1) {
      local_4d8 = -100;
      goto LAB_001ed257;
    }
    local_444 = local_484;
    local_448 = local_480;
    iVar4 = local_484 - local_460;
    iVar6 = *(int *)((long)&in_RDI[3].refcount + 4);
    iVar5 = local_480 - local_464;
    sVar2 = in_RDI[3].elemsize;
    local_4bc = 1;
    if (((*(byte *)(in_RCX + 0x27) & 1) != 0) && (local_4bc = 1, (int)in_RDI[2].cstep % 4 == 0)) {
      local_4bc = 4;
    }
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                (int)((ulong)in_stack_fffffffffffff988 >> 0x20),(int)in_stack_fffffffffffff988,iVar3
                ,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                in_stack_fffffffffffff974,
                (Allocator *)
                CONCAT17(in_stack_fffffffffffff9f7,
                         CONCAT16(in_stack_fffffffffffff9f6,in_stack_fffffffffffff9f0)));
    bVar7 = true;
    if (*in_RDX != (void *)0x0) {
      bVar7 = (long)in_RDX[8] * (long)*(int *)(in_RDX + 7) == 0;
    }
    if (bVar7) {
      local_4d8 = -100;
      goto LAB_001ed257;
    }
    if ((((*(byte *)(in_RCX + 0x27) & 1) == 0) &&
        (*(int *)((long)&in_RDI[2].cstep + 4) == *(int *)&in_RDI[3].data)) &&
       ((*(int *)((long)&in_RDI[3].data + 4) != 1 &&
        ((((*(int *)&in_RDI[3].refcount == *(int *)((long)&in_RDI[3].data + 4) &&
           (*(int *)((long)&in_RDI[3].refcount + 4) == 1)) && ((int)in_RDI[3].elemsize == 1)) &&
         ((*(int *)((long)&in_RDI[3].data + 4) <= iVar4 / iVar6 + 1 &&
          (*(int *)&in_RDI[3].refcount <= iVar5 / (int)sVar2 + 1)))))))) {
      local_4d8 = forwardDilation_x86(in_stack_fffffffffffffd28,
                                      (Mat *)CONCAT44(in_stack_fffffffffffffd24,
                                                      in_stack_fffffffffffffd20),top_blob_00,in_RSI)
      ;
      goto LAB_001ed257;
    }
    iVar3 = local_44c * local_45c;
    if ((((*(byte *)(in_RCX + 0x37) & 1) != 0) ||
        (((*(byte *)(in_RCX + 0x38) & 1) != 0 ||
         (bVar7 = false, (*(byte *)(in_RCX + 0x39) & 1) != 0)))) && (bVar7 = true, iVar3 < 9)) {
      bVar7 = 8 < (int)in_RDI[2].cstep;
    }
    if (((((*(byte *)(in_RCX + 0x1c) & 1) == 0) || (!bVar7)) ||
        (*(int *)((long)&in_RDI[2].cstep + 4) != 3)) ||
       (((*(int *)&in_RDI[3].data != 3 || (*(int *)((long)&in_RDI[3].data + 4) != 1)) ||
        ((*(int *)&in_RDI[3].refcount != 1 ||
         ((*(int *)((long)&in_RDI[3].refcount + 4) != 1 || ((int)in_RDI[3].elemsize != 1)))))))) {
      iVar6 = get_cpu_level2_cache_size();
      bVar7 = true;
      if ((iVar3 * (int)in_RDI[2].cstep * *(int *)((long)&in_RDI[2].cstep + 4) *
           *(int *)&in_RDI[3].data * *(int *)((long)&in_RDI[3].data + 4) *
           *(int *)&in_RDI[3].refcount * *(int *)((long)&in_RDI[3].refcount + 4) *
           (int)in_RDI[3].elemsize * 8 <= iVar6) && (bVar7 = true, iVar3 < 0x11)) {
        bVar7 = 0x10 < (int)in_RDI[2].cstep;
      }
      if ((((*(byte *)(in_RCX + 0x1d) & 1) != 0) && (bVar7)) ||
         ((*(int *)((long)&in_RDI[2].cstep + 4) == 1 && (*(int *)&in_RDI[3].data == 1)))) {
        if ((*(int *)&in_RDI[10].data != 0) && (*(int *)(in_RCX + 4) != *(int *)&in_RDI[10].data)) {
          fprintf(_stderr,"opt.num_threads %d changed, convolution gemm will use load-time value %d"
                  ,(ulong)*(uint *)(in_RCX + 4),(ulong)*(uint *)&in_RDI[10].data);
          fprintf(_stderr,"\n");
        }
        local_4d8 = convolution_im2col_gemm
                              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                               in_stack_fffffffffffffe48,
                               (Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                               (int)in_stack_fffffffffffffe38,in_stack_00000470,in_stack_00000478,
                               in_stack_00000480,in_stack_00000488,in_stack_00000490,
                               in_stack_00000498);
        if (local_4d8 == 0) {
          if (in_RDI[9].cstep != 0) {
            (**(code **)(*(long *)in_RDI[9].cstep + 0x48))((long *)in_RDI[9].cstep,in_RDX,in_RCX);
          }
          local_4d8 = 0;
        }
        goto LAB_001ed257;
      }
      if ((local_45c == 1) && (local_4bc == 4)) {
        if (((*(int *)((long)&in_RDI[2].cstep + 4) == 3) &&
            (((*(int *)&in_RDI[3].data == 3 && (*(int *)((long)&in_RDI[3].data + 4) == 1)) &&
             (*(int *)&in_RDI[3].refcount == 1)))) &&
           ((*(int *)((long)&in_RDI[3].refcount + 4) == 1 && ((int)in_RDI[3].elemsize == 1)))) {
          conv3x3s1_pack1to4_sse
                    (in_stack_000011d0,in_stack_000011c8,in_stack_000011c0,in_stack_000011b8,
                     in_stack_000011b0);
          if (in_RDI[9].cstep != 0) {
            (**(code **)(*(long *)in_RDI[9].cstep + 0x48))((long *)in_RDI[9].cstep,in_RDX,in_RCX);
          }
          local_4d8 = 0;
          goto LAB_001ed257;
        }
        if ((*(int *)((long)&in_RDI[2].cstep + 4) == 3) &&
           (((*(int *)&in_RDI[3].data == 3 && (*(int *)((long)&in_RDI[3].data + 4) == 1)) &&
            ((*(int *)&in_RDI[3].refcount == 1 &&
             ((*(int *)((long)&in_RDI[3].refcount + 4) == 2 && ((int)in_RDI[3].elemsize == 2))))))))
        {
          conv3x3s2_pack1to4_sse
                    (in_stack_00001b80,in_stack_00001b78,in_stack_00001b70,in_stack_00001b68,
                     in_stack_00001b60);
          if (in_RDI[9].cstep != 0) {
            (**(code **)(*(long *)in_RDI[9].cstep + 0x48))((long *)in_RDI[9].cstep,in_RDX,in_RCX);
          }
          local_4d8 = 0;
          goto LAB_001ed257;
        }
      }
      convolution_packed(in_stack_000007c8,in_stack_000007c0,in_stack_000007b8,in_stack_000007b0,
                         in_stack_000007ac,in_stack_000007a8,in_stack_00003e30,in_stack_00003e38,
                         in_stack_00003e40,in_stack_00003e48,in_stack_00003e50,in_stack_00003e58,
                         in_stack_00003e60);
      local_4d8 = 0;
      goto LAB_001ed257;
    }
    local_4ce = test_prefer_winograd63
                          (in_stack_fffffffffffff970,in_stack_fffffffffffff96c,
                           in_stack_fffffffffffff968,in_stack_fffffffffffff964);
    local_4cf = test_prefer_winograd23
                          (in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20)
                           ,(int)in_stack_fffffffffffff998,in_stack_fffffffffffff994);
    local_5fd = 0;
    if (!local_4ce) {
      local_5fd = local_4cf ^ 0xff;
    }
    local_4d0 = local_5fd & 1;
    if (local_4cf) {
      if ((*(byte *)(in_RCX + 0x37) & 1) != 0) {
        bVar7 = true;
        if (in_RDI[0xc].refcount != (int *)0x0) {
          bVar7 = (long)in_RDI[0xd].data * (long)(int)in_RDI[0xc].cstep == 0;
        }
        if (!bVar7) goto LAB_001ec881;
      }
      local_4cf = false;
      local_4d0 = 1;
    }
LAB_001ec881:
    if (local_4ce) {
      if ((*(byte *)(in_RCX + 0x39) & 1) != 0) {
        bVar7 = true;
        if (in_RDI[0xe].refcount != (int *)0x0) {
          bVar7 = (long)in_RDI[0xf].data * (long)(int)in_RDI[0xe].cstep == 0;
        }
        if (!bVar7) goto LAB_001ec933;
      }
      local_4ce = false;
      local_4d0 = 1;
    }
LAB_001ec933:
    if (local_4d0 != 0) {
      if ((*(byte *)(in_RCX + 0x38) & 1) != 0) {
        bVar7 = true;
        if (in_RDI[0xd].refcount != (int *)0x0) {
          bVar7 = (long)in_RDI[0xe].data * (long)(int)in_RDI[0xd].cstep == 0;
        }
        if (!bVar7) goto LAB_001eca65;
      }
      local_4d0 = 0;
      if ((*(byte *)(in_RCX + 0x39) & 1) != 0) {
        bVar7 = true;
        if (in_RDI[0xe].refcount != (int *)0x0) {
          bVar7 = (long)in_RDI[0xf].data * (long)(int)in_RDI[0xe].cstep == 0;
        }
        if (!bVar7) {
          local_4ce = true;
          goto LAB_001eca65;
        }
      }
      local_4cf = true;
    }
LAB_001eca65:
    if ((*(int *)&in_RDI[10].data != 0) && (*(int *)(in_RCX + 4) != *(int *)&in_RDI[10].data)) {
      fprintf(_stderr,"opt.num_threads %d changed, convolution winograd will use load-time value %d"
              ,(ulong)*(uint *)(in_RCX + 4),(ulong)*(uint *)&in_RDI[10].data);
      fprintf(_stderr,"\n");
    }
    local_4d8 = 0;
    if (local_4cf == false) {
      if (local_4d0 == 0) {
        if (local_4ce != false) {
          local_4d8 = conv3x3s1_winograd63
                                (in_stack_00000060,in_stack_00000058,in_stack_00000050,
                                 in_stack_00000048,in_stack_00000044,in_stack_00000038);
        }
      }
      else {
        local_4d8 = conv3x3s1_winograd43
                              (in_stack_00000060,in_stack_00000058,in_stack_00000050,
                               in_stack_00000048,in_stack_00000044,in_stack_00000038);
      }
    }
    else {
      local_4d8 = conv3x3s1_winograd23
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000044,in_stack_00000038);
    }
    if (local_4d8 == 0) {
      if (in_RDI[9].cstep != 0) {
        (**(code **)(*(long *)in_RDI[9].cstep + 0x48))((long *)in_RDI[9].cstep,in_RDX,in_RCX);
      }
      local_4d8 = 0;
    }
LAB_001ed257:
    local_3a4 = 1;
    ppvVar8 = &local_4b0;
    if (local_4a8 != (int *)0x0) {
      LOCK();
      iVar3 = *local_4a8;
      *local_4a8 = *local_4a8 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (local_490 == (long *)0x0) {
          if (local_4b0 != (void *)0x0) {
            free(local_4b0);
          }
        }
        else {
          (**(code **)(*local_490 + 0x18))(local_490,local_4b0);
        }
      }
    }
    *ppvVar8 = (void *)0x0;
    ppvVar8[2] = (void *)0x0;
    *(undefined4 *)(ppvVar8 + 3) = 0;
    *(undefined4 *)(ppvVar8 + 5) = 0;
    *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
    *(undefined4 *)(ppvVar8 + 6) = 0;
    *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
    *(undefined4 *)(ppvVar8 + 7) = 0;
    ppvVar8[8] = (void *)0x0;
    ppvVar8[1] = (void *)0x0;
    return local_4d8;
  }
  local_348 = (void *)0x0;
  pAVar9 = (Allocator *)0x0;
  plVar10 = (long *)0x0;
  local_310 = 0;
  local_308 = 0;
  if (((ulong)in_RSI->workspace_allocator & 0xf) == 0) {
    if ((Option *)&local_348 != in_RSI) {
      if (in_RSI->blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&in_RSI->blob_allocator->_vptr_Allocator =
             *(int *)&in_RSI->blob_allocator->_vptr_Allocator + 1;
        UNLOCK();
      }
      local_348 = *(void **)in_RSI;
      pAVar9 = in_RSI->blob_allocator;
      plVar10 = *(long **)&in_RSI->use_bf16_storage;
    }
  }
  else {
    Mat::reshape(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                 (Allocator *)CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
    if (&local_348 != &local_3a0) {
      if (local_398 != (Allocator *)0x0) {
        LOCK();
        *(int *)&local_398->_vptr_Allocator = *(int *)&local_398->_vptr_Allocator + 1;
        UNLOCK();
      }
      if (pAVar9 != (Allocator *)0x0) {
        LOCK();
        iVar3 = *(int *)&pAVar9->_vptr_Allocator;
        *(int *)&pAVar9->_vptr_Allocator = *(int *)&pAVar9->_vptr_Allocator + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (plVar10 == (long *)0x0) {
            if (local_348 != (void *)0x0) {
              free(local_348);
            }
          }
          else {
            (**(code **)(*plVar10 + 0x18))(plVar10,local_348);
          }
        }
      }
      local_348 = local_3a0;
      local_310 = local_368;
      local_308 = local_360;
      pAVar9 = local_398;
      plVar10 = local_380;
    }
    if (local_398 != (Allocator *)0x0) {
      LOCK();
      iVar3 = *(int *)&local_398->_vptr_Allocator;
      *(int *)&local_398->_vptr_Allocator = *(int *)&local_398->_vptr_Allocator + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (local_380 == (long *)0x0) {
          if (local_3a0 != (void *)0x0) {
            free(local_3a0);
          }
        }
        else {
          (**(code **)(*local_380 + 0x18))(local_380,local_3a0);
        }
      }
    }
    local_3a0 = (void *)0x0;
    local_390 = 0;
    local_388 = 0;
    local_378 = 0;
    local_374 = 0;
    local_370 = 0;
    local_36c = 0;
    local_368 = 0;
    local_360 = 0;
    local_398 = (Allocator *)0x0;
    if (local_348 == (void *)0x0 || local_308 * local_310 == 0) {
      iVar3 = -100;
      local_3a4 = 1;
      goto LAB_001ebdd9;
    }
  }
  local_3f0 = (void *)0x0;
  local_3e8 = (int *)0x0;
  local_3e0 = (void *)0x0;
  local_3d8 = 0;
  local_3d0 = (long *)0x0;
  local_3c8 = 0;
  local_3c4 = 0;
  local_3c0 = 0;
  local_3bc = 0;
  local_3b8 = 0;
  local_3b0 = (void *)0x0;
  local_3f4 = (**(code **)((long)in_RDI->data + 0x38))(in_RDI,&local_348,&local_3f0,in_RCX);
  iVar3 = local_3f4;
  if (local_3f4 == 0) {
    if (((ulong)local_3e0 & 0xf) == 0) {
      if (in_RDX != &local_3f0) {
        if (local_3e8 != (int *)0x0) {
          LOCK();
          *local_3e8 = *local_3e8 + 1;
          UNLOCK();
        }
        if (in_RDX[1] != (void *)0x0) {
          piVar1 = (int *)in_RDX[1];
          LOCK();
          iVar3 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar3 == 1) {
            if (in_RDX[4] == (void *)0x0) {
              if (*in_RDX != (void *)0x0) {
                free(*in_RDX);
              }
            }
            else {
              (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = (void *)0x0;
        in_RDX[2] = (void *)0x0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = (void *)0x0;
        in_RDX[1] = (void *)0x0;
        *in_RDX = local_3f0;
        in_RDX[1] = local_3e8;
        in_RDX[2] = local_3e0;
        *(undefined4 *)(in_RDX + 3) = local_3d8;
        in_RDX[4] = local_3d0;
        *(undefined4 *)(in_RDX + 5) = local_3c8;
        *(undefined4 *)((long)in_RDX + 0x2c) = local_3c4;
        *(undefined4 *)(in_RDX + 6) = local_3c0;
        *(undefined4 *)((long)in_RDX + 0x34) = local_3bc;
        *(undefined4 *)(in_RDX + 7) = local_3b8;
        in_RDX[8] = local_3b0;
      }
      *(undefined4 *)(in_RDX + 5) = 1;
      *(undefined4 *)((long)in_RDX + 0x2c) = local_3b8;
      *(undefined4 *)(in_RDX + 6) = 1;
      *(undefined4 *)(in_RDX + 7) = 1;
    }
    else {
      Mat::reshape((Mat *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
      if (in_RDX != &local_440) {
        if (local_438 != (int *)0x0) {
          LOCK();
          *local_438 = *local_438 + 1;
          UNLOCK();
        }
        if (in_RDX[1] != (void *)0x0) {
          piVar1 = (int *)in_RDX[1];
          LOCK();
          iVar3 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar3 == 1) {
            if (in_RDX[4] == (void *)0x0) {
              if (*in_RDX != (void *)0x0) {
                free(*in_RDX);
              }
            }
            else {
              (**(code **)(*in_RDX[4] + 0x18))(in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = (void *)0x0;
        in_RDX[2] = (void *)0x0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = (void *)0x0;
        in_RDX[1] = (void *)0x0;
        *in_RDX = local_440;
        in_RDX[1] = local_438;
        in_RDX[2] = local_430;
        *(undefined4 *)(in_RDX + 3) = local_428;
        in_RDX[4] = local_420;
        *(undefined4 *)(in_RDX + 5) = local_418;
        *(undefined4 *)((long)in_RDX + 0x2c) = local_414;
        *(undefined4 *)(in_RDX + 6) = local_410;
        *(undefined4 *)((long)in_RDX + 0x34) = local_40c;
        *(undefined4 *)(in_RDX + 7) = local_408;
        in_RDX[8] = local_400;
      }
      ppvVar8 = &local_440;
      if (local_438 != (int *)0x0) {
        LOCK();
        iVar3 = *local_438;
        *local_438 = *local_438 + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (local_420 == (long *)0x0) {
            if (local_440 != (void *)0x0) {
              free(local_440);
            }
          }
          else {
            (**(code **)(*local_420 + 0x18))(local_420,local_440);
          }
        }
      }
      *ppvVar8 = (void *)0x0;
      ppvVar8[2] = (void *)0x0;
      *(undefined4 *)(ppvVar8 + 3) = 0;
      *(undefined4 *)(ppvVar8 + 5) = 0;
      *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
      *(undefined4 *)(ppvVar8 + 6) = 0;
      *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
      *(undefined4 *)(ppvVar8 + 7) = 0;
      ppvVar8[8] = (void *)0x0;
      ppvVar8[1] = (void *)0x0;
      bVar7 = true;
      if (*in_RDX != (void *)0x0) {
        bVar7 = (long)in_RDX[8] * (long)*(int *)(in_RDX + 7) == 0;
      }
      if (bVar7) {
        iVar3 = -100;
        goto LAB_001ebb89;
      }
    }
    iVar3 = 0;
  }
LAB_001ebb89:
  local_3a4 = 1;
  if (local_3e8 != (int *)0x0) {
    LOCK();
    iVar6 = *local_3e8;
    *local_3e8 = *local_3e8 + -1;
    UNLOCK();
    if (iVar6 == 1) {
      if (local_3d0 == (long *)0x0) {
        if (local_3f0 != (void *)0x0) {
          free(local_3f0);
        }
      }
      else {
        (**(code **)(*local_3d0 + 0x18))(local_3d0,local_3f0);
      }
    }
  }
  local_3f0 = (void *)0x0;
  local_3d8 = 0;
  local_3c8 = 0;
  local_3c4 = 0;
  local_3c0 = 0;
  local_3bc = 0;
  local_3b0 = (void *)0x0;
  local_3e8 = (int *)0x0;
LAB_001ebdd9:
  if (pAVar9 != (Allocator *)0x0) {
    LOCK();
    iVar6 = *(int *)&pAVar9->_vptr_Allocator;
    *(int *)&pAVar9->_vptr_Allocator = *(int *)&pAVar9->_vptr_Allocator + -1;
    UNLOCK();
    if (iVar6 == 1) {
      if (plVar10 == (long *)0x0) {
        if (local_348 != (void *)0x0) {
          free(local_348);
        }
      }
      else {
        (**(code **)(*plVar10 + 0x18))(plVar10,local_348);
      }
    }
  }
  return iVar3;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}